

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O3

bool __thiscall Imf_2_5::DeepTiledInputFile::isValidLevel(DeepTiledInputFile *this,int lx,int ly)

{
  Data *pDVar1;
  
  if ((-1 < (ly | lx)) &&
     (((pDVar1 = this->_data, lx == ly || ((pDVar1->tileDesc).mode != MIPMAP_LEVELS)) &&
      (lx < pDVar1->numXLevels)))) {
    return ly < pDVar1->numYLevels;
  }
  return false;
}

Assistant:

bool
DeepTiledInputFile::isValidLevel (int lx, int ly) const
{
    if (lx < 0 || ly < 0)
        return false;

    if (levelMode() == MIPMAP_LEVELS && lx != ly)
        return false;

    if (lx >= numXLevels() || ly >= numYLevels())
        return false;

    return true;
}